

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFARegExecRollBack(xmlRegExecCtxtPtr exec)

{
  xmlRegExecRollback *pxVar1;
  ulong uVar2;
  long lVar3;
  
  if (exec->status == 0) {
    if ((long)exec->nbRollbacks < 1) {
      exec->status = -1;
      return;
    }
    uVar2 = (long)exec->nbRollbacks - 1;
    exec->nbRollbacks = (int)uVar2;
    pxVar1 = exec->rollbacks;
    exec->state = pxVar1[uVar2 & 0xffffffff].state;
    exec->index = pxVar1[uVar2].index;
    exec->transno = pxVar1[uVar2].nextbranch;
    lVar3 = (long)exec->comp->nbCounters;
    if (0 < lVar3) {
      if (pxVar1[uVar2].counts == (int *)0x0) {
        exec->status = -4;
        return;
      }
      if (exec->counts != (int *)0x0) {
        memcpy(exec->counts,pxVar1[uVar2].counts,lVar3 << 2);
        return;
      }
    }
  }
  return;
}

Assistant:

static void
xmlFARegExecRollBack(xmlRegExecCtxtPtr exec) {
    if (exec->status != XML_REGEXP_OK)
        return;
    if (exec->nbRollbacks <= 0) {
	exec->status = XML_REGEXP_NOT_FOUND;
	return;
    }
    exec->nbRollbacks--;
    exec->state = exec->rollbacks[exec->nbRollbacks].state;
    exec->index = exec->rollbacks[exec->nbRollbacks].index;
    exec->transno = exec->rollbacks[exec->nbRollbacks].nextbranch;
    if (exec->comp->nbCounters > 0) {
	if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
	    exec->status = XML_REGEXP_INTERNAL_ERROR;
	    return;
	}
	if (exec->counts) {
	    memcpy(exec->counts, exec->rollbacks[exec->nbRollbacks].counts,
	       exec->comp->nbCounters * sizeof(int));
	}
    }
}